

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O0

void __thiscall c4::yml::Parser::State::reset(State *this,char *file,size_t node_id_)

{
  undefined8 in_RDX;
  char *in_RDI;
  csubstr cVar1;
  char *local_28;
  size_t local_20;
  
  in_RDI[0] = '\x03';
  in_RDI[1] = '\0';
  in_RDI[2] = '\0';
  in_RDI[3] = '\0';
  in_RDI[8] = '\0';
  in_RDI[9] = '\0';
  in_RDI[10] = '\0';
  in_RDI[0xb] = '\0';
  in_RDI[0xc] = '\0';
  in_RDI[0xd] = '\0';
  in_RDI[0xe] = '\0';
  in_RDI[0xf] = '\0';
  cVar1 = to_csubstr(in_RDI);
  local_28 = cVar1.str;
  *(char **)(in_RDI + 0x48) = local_28;
  local_20 = cVar1.len;
  *(size_t *)(in_RDI + 0x50) = local_20;
  in_RDI[0x30] = '\0';
  in_RDI[0x31] = '\0';
  in_RDI[0x32] = '\0';
  in_RDI[0x33] = '\0';
  in_RDI[0x34] = '\0';
  in_RDI[0x35] = '\0';
  in_RDI[0x36] = '\0';
  in_RDI[0x37] = '\0';
  in_RDI[0x38] = '\x01';
  in_RDI[0x39] = '\0';
  in_RDI[0x3a] = '\0';
  in_RDI[0x3b] = '\0';
  in_RDI[0x3c] = '\0';
  in_RDI[0x3d] = '\0';
  in_RDI[0x3e] = '\0';
  in_RDI[0x3f] = '\0';
  in_RDI[0x40] = '\x01';
  in_RDI[0x41] = '\0';
  in_RDI[0x42] = '\0';
  in_RDI[0x43] = '\0';
  in_RDI[0x44] = '\0';
  in_RDI[0x45] = '\0';
  in_RDI[0x46] = '\0';
  in_RDI[0x47] = '\0';
  *(undefined8 *)(in_RDI + 0x10) = in_RDX;
  in_RDI[0x28] = '\0';
  in_RDI[0x29] = '\0';
  in_RDI[0x2a] = '\0';
  in_RDI[0x2b] = '\0';
  in_RDI[0x2c] = '\0';
  in_RDI[0x2d] = '\0';
  in_RDI[0x2e] = '\0';
  in_RDI[0x2f] = '\0';
  basic_substring<const_char>::clear((basic_substring<const_char> *)(in_RDI + 0x18));
  in_RDI[0x90] = '\0';
  in_RDI[0x91] = '\0';
  in_RDI[0x92] = '\0';
  in_RDI[0x93] = '\0';
  in_RDI[0x94] = '\0';
  in_RDI[0x95] = '\0';
  in_RDI[0x96] = '\0';
  in_RDI[0x97] = '\0';
  return;
}

Assistant:

void reset(const char *file, size_t node_id_)
        {
            flags = RUNK|RTOP;
            level = 0;
            pos.name = to_csubstr(file);
            pos.offset = 0;
            pos.line = 1;
            pos.col = 1;
            node_id = node_id_;
            scalar_col = 0;
            scalar.clear();
            indref = 0;
        }